

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::log_assert(XmlReporter *this,AssertData *rb)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RSI;
  XmlReporter *in_RDI;
  lock_guard<std::mutex> lock;
  string *in_stack_fffffffffffffc58;
  XmlWriter *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  string *text;
  XmlWriter *in_stack_fffffffffffffc70;
  ScopedElement *this_01;
  string *in_stack_fffffffffffffc80;
  XmlWriter *in_stack_fffffffffffffc88;
  XmlWriter *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  XmlWriter *in_stack_fffffffffffffcf0;
  allocator<char> local_2a1 [40];
  ScopedElement local_279 [6];
  string local_249;
  allocator<char> local_221 [48];
  allocator<char> local_1f1 [17];
  undefined8 in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  XmlWriter *in_stack_fffffffffffffe30;
  allocator<char> local_199 [40];
  allocator<char> local_171 [33];
  XmlReporter *in_stack_fffffffffffffeb0;
  allocator<char> local_141 [40];
  allocator<char> local_119 [41];
  uint local_f0;
  allocator<char> local_e9 [40];
  allocator<char> local_c1 [40];
  allocator<char> local_99 [40];
  allocator<char> local_71 [56];
  allocator<char> local_39 [41];
  long local_10;
  
  if (((*(byte *)(in_RSI + 0x28) & 1) != 0) || ((in_RDI->opt->success & 1U) != 0)) {
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffc60,
               (mutex_type *)in_stack_fffffffffffffc58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    XmlWriter::startElement(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    assertString(*(Enum *)(local_10 + 8));
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    skipPathFromFilename((char *)in_stack_fffffffffffffc68);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    local_f0 = line(in_RDI,*(uint *)(local_10 + 0x18));
    XmlWriter::writeAttribute<unsigned_int>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe20
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_e9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_c1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_99);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_71);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    XmlWriter::scopedElement(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    XmlWriter::ScopedElement::writeText
              ((ScopedElement *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_141);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(local_119);
    if ((*(byte *)(local_10 + 0x29) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::scopedElement(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      String::c_str((String *)0x1244c5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                 SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator(local_199);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator(local_171);
    }
    if ((*(uint *)(local_10 + 8) & 0x20) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::scopedElement(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      in_stack_fffffffffffffc98 = *(char **)(local_10 + 0x68);
      in_stack_fffffffffffffca0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                 SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator(local_1f1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
    }
    if ((*(uint *)(local_10 + 8) & 0x40) != 0) {
      in_stack_fffffffffffffc88 = &in_RDI->xml;
      in_stack_fffffffffffffc90 = (XmlWriter *)local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::scopedElement(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      in_stack_fffffffffffffc80 = &local_249;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                 SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator(local_221);
    }
    if (((*(uint *)(local_10 + 8) & 8) != 0) && ((*(byte *)(local_10 + 0x29) & 1) == 0)) {
      text = (string *)&in_RDI->xml;
      this_01 = local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::scopedElement(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                String::c_str((String *)0x124c07);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator<char> *)in_stack_fffffffffffffc90);
      XmlWriter::ScopedElement::writeText(this_01,text,SUB81((ulong)this_00 >> 0x38,0));
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator(local_2a1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator((allocator<char> *)local_279);
    }
    log_contexts(in_stack_fffffffffffffeb0);
    XmlWriter::endElement(in_stack_fffffffffffffc90);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x124d7a);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed && !opt.success)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Expression")
                    .writeAttribute("success", !rb.m_failed)
                    .writeAttribute("type", assertString(rb.m_at))
                    .writeAttribute("filename", skipPathFromFilename(rb.m_file))
                    .writeAttribute("line", line(rb.m_line));

            xml.scopedElement("Original").writeText(rb.m_expr);

            if(rb.m_threw)
                xml.scopedElement("Exception").writeText(rb.m_exception.c_str());

            if(rb.m_at & assertType::is_throws_as)
                xml.scopedElement("ExpectedException").writeText(rb.m_exception_type);
            if(rb.m_at & assertType::is_throws_with)
                xml.scopedElement("ExpectedExceptionString").writeText(rb.m_exception_string);
            if((rb.m_at & assertType::is_normal) && !rb.m_threw)
                xml.scopedElement("Expanded").writeText(rb.m_decomp.c_str());

            log_contexts();

            xml.endElement();
        }